

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O0

argParserAdvancedConfiguration * __thiscall
argParserAdvancedConfiguration::generateAutoCompletion_abi_cxx11_
          (argParserAdvancedConfiguration *this)

{
  value_type paVar1;
  size_type sVar2;
  reference ppsVar3;
  reference ppaVar4;
  ulong uVar5;
  long in_RSI;
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  int local_60;
  int local_5c;
  int y;
  int i;
  string topLevelArgs;
  argument *arg;
  allocator local_1a;
  byte local_19;
  argParserAdvancedConfiguration *this_local;
  string *script;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"#/usr/bin/env bash\n_function()\n{\n\n",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::__cxx11::string::string((string *)&y);
  local_5c = 0;
  while( true ) {
    uVar5 = (ulong)local_5c;
    sVar2 = std::
            vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            ::size(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                     **)(in_RSI + 0x60));
    if (sVar2 <= uVar5) break;
    local_60 = 0;
    while( true ) {
      uVar5 = (ulong)local_60;
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       **)(in_RSI + 0x60),(long)local_5c);
      sVar2 = std::
              vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
              ::size((*ppsVar3)->arguments);
      if (sVar2 <= uVar5) break;
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       **)(in_RSI + 0x60),(long)local_5c);
      ppaVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at((*ppsVar3)->arguments,(long)local_60);
      paVar1 = *ppaVar4;
      std::operator+(local_80,(char *)&paVar1->argLong);
      std::__cxx11::string::operator+=((string *)&y,(string *)local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::operator+((char *)local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "if [ \"${COMP_WORDS[${COMP_CWORD} -1 ]}\" == \"");
      std::operator+(local_e0,(char *)local_100);
      std::operator+(local_c0,local_e0);
      std::operator+(local_a0,(char *)local_c0);
      std::__cxx11::string::operator+=((string *)this,(string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string(local_100);
      if ((paVar1->enumIsFile & 1U) == 0) {
        std::operator+((char *)local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11774a
                      );
        std::operator+(local_120,(char *)local_140);
        std::__cxx11::string::operator+=((string *)this,(string *)local_120);
        std::__cxx11::string::~string((string *)local_120);
        std::__cxx11::string::~string(local_140);
      }
      else {
        std::__cxx11::string::operator+=
                  ((string *)this,
                   "    compopt -o nospace -o dirnames -o filenames\n    COMPREPLY=($(compgen  -f \"${COMP_WORDS[${COMP_CWORD}]}\"))      \n"
                  );
      }
      std::__cxx11::string::operator+=((string *)this,"\n   el");
      local_60 = local_60 + 1;
    }
    local_5c = local_5c + 1;
  }
  std::operator+((char *)local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "se\n     COMPREPLY=($(compgen -W \"");
  std::operator+(local_160,(char *)local_180);
  std::__cxx11::string::operator+=((string *)this,(string *)local_160);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::operator+=((string *)this,"  fi\n compgen -o bashdefault\n}\n");
  std::__cxx11::string::operator+=((string *)this,"complete -F _function ");
  std::__cxx11::string::operator=((string *)autoCompletionScript_abi_cxx11_,(string *)this);
  local_19 = 1;
  std::__cxx11::string::~string((string *)&y);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string argParserAdvancedConfiguration::generateAutoCompletion() {

    string script = "#/usr/bin/env bash\n_function()\n{\n\n";
    argument * arg;
    string topLevelArgs;
    for (int i = 0; i < newargconfig->size(); i++) {
        for(int y = 0; y<newargconfig->at(i)->arguments->size();y++){
            arg = newargconfig->at(i)->arguments->at(y);
            topLevelArgs += arg->argLong + " ";
            script += R"(if [ "${COMP_WORDS[${COMP_CWORD} -1 ]}" == ")" + arg->argLong +
                      R"(" ] || [ "${COMP_WORDS[${COMP_CWORD} -1 ]}" == ")" + arg->argShort +
                      "\" ]; then\n";
            if (arg->enumIsFile) {
                script += "    compopt -o nospace -o dirnames -o filenames\n"
                          "    COMPREPLY=($(compgen  -f \"${COMP_WORDS[${COMP_CWORD}]}\"))      \n";
            } else {
                script += "     COMPREPLY=($(compgen -W \"" + arg->enums +
                          "\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n";
            }
            script += "\n   el";
        }
    }


    script += "se\n     COMPREPLY=($(compgen -W \"" + topLevelArgs + "\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n";
    script += "  fi\n compgen -o bashdefault\n}\n";
    script += "complete -F _function ";
    autoCompletionScript = script;
    return script;

}